

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vec.h
# Opt level: O0

float __thiscall crnlib::vec<2U,_float>::squared_distance(vec<2U,_float> *this,vec<2U,_float> *rhs)

{
  float fVar1;
  uint local_20;
  float d;
  uint i;
  float dist2;
  vec<2U,_float> *rhs_local;
  vec<2U,_float> *this_local;
  
  d = 0.0;
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    fVar1 = this->m_s[local_20] - rhs->m_s[local_20];
    d = fVar1 * fVar1 + d;
  }
  return d;
}

Assistant:

inline T squared_distance(const vec& rhs) const
        {
            T dist2 = 0;
            for (uint i = 0; i < N; i++)
            {
                T d = m_s[i] - rhs.m_s[i];
                dist2 += d * d;
            }
            return dist2;
        }